

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deriv.c
# Opt level: O0

void copyitems(Item *q1,Item *q2,Item *qdest)

{
  int iVar1;
  Item *in_RSI;
  List *in_RDI;
  Item *q;
  undefined4 in_stack_ffffffffffffffd8;
  
  do {
    if (in_RSI == in_RDI) {
      return;
    }
    iVar1 = (int)in_RSI->itemtype;
    if (iVar1 == 1) {
      linsertsym(in_RSI,(Symbol *)CONCAT44(1,in_stack_ffffffffffffffd8));
    }
    else {
      if ((iVar1 != 0x102) && (iVar1 != 0x143)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/deriv.c"
                      ,0x3f5,"void copyitems()");
      }
      linsertstr(in_RSI,(char *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    }
    in_RSI = in_RSI->prev;
  } while( true );
}

Assistant:

void copyitems(q1, q2, qdest) /* copy items before item */
	Item* q1, *q2, *qdest;
{
	Item* q;
	for (q = q2; q != q1; q = q->prev) {
		switch(q->itemtype) {

		case STRING:
        case VERBATIM:
			Linsertstr(qdest, STR(q));
			break;
		case SYMBOL:
			Linsertsym(qdest, SYM(q));
			break;
		default:
			/*SUPPRESS 622*/
			assert(0);
		}
	}
}